

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDFace::VertexIndex(ON_SubDFace *this,ON_SubDVertex *vertex)

{
  ulong uVar1;
  ulong uVar2;
  uint local_50;
  uint local_4c;
  ON_SubDEdge *edge;
  ON__UINT_PTR e_ptr;
  uint i;
  uint edge_count;
  ON_SubDEdgePtr *face_edges;
  ON_SubDVertex *vertex_local;
  ON_SubDFace *this_local;
  
  if (vertex != (ON_SubDVertex *)0x0) {
    _i = this->m_edge4;
    local_4c = (uint)this->m_edge_count;
    for (e_ptr._0_4_ = 0; (uint)e_ptr < local_4c; e_ptr._0_4_ = (uint)e_ptr + 2) {
      if ((uint)e_ptr == 4) {
        if (this->m_edgex == (ON_SubDEdgePtr *)0x0) {
          return 0xffffffff;
        }
        _i = this->m_edgex + -4;
      }
      uVar1 = _i[(uint)e_ptr].m_ptr;
      uVar2 = uVar1 & 0xfffffffffffffff8;
      if (uVar2 != 0) {
        if (vertex == *(ON_SubDVertex **)(uVar2 + 0x80)) {
          if ((uVar1 & 1) == 0) {
            local_4c = (uint)e_ptr;
          }
          else {
            local_4c = ((uint)e_ptr + 1) % local_4c;
          }
          return local_4c;
        }
        if (vertex == *(ON_SubDVertex **)(uVar2 + 0x88)) {
          if ((uVar1 & 1) == 0) {
            local_50 = ((uint)e_ptr + 1) % local_4c;
          }
          else {
            local_50 = (uint)e_ptr;
          }
          return local_50;
        }
      }
    }
  }
  return 0xffffffff;
}

Assistant:

unsigned int ON_SubDFace::VertexIndex(
  const ON_SubDVertex* vertex
  ) const
{
  if (nullptr == vertex)
    return ON_UNSET_UINT_INDEX;

  const ON_SubDEdgePtr* face_edges = m_edge4;
  const unsigned int edge_count = m_edge_count;

  for (unsigned int i = 0; i < edge_count; i += 2)
  {
    if (4 == i)
    {
      face_edges = m_edgex;
      if (nullptr == face_edges)
        break;
      face_edges -= 4;
    }
    ON__UINT_PTR e_ptr = face_edges[i].m_ptr;
    const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(e_ptr);
    if (nullptr != edge)
    {
      if (vertex == edge->m_vertex[0])
        return (0 == ON_SUBD_EDGE_DIRECTION(e_ptr)) ? i : ((i + 1) % edge_count);
      if (vertex == edge->m_vertex[1])
        return (0 == ON_SUBD_EDGE_DIRECTION(e_ptr)) ? ((i + 1) % edge_count) : i;
    }
  }

  return ON_UNSET_UINT_INDEX;
}